

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O3

void __thiscall InterleavedSudoku::permuteNumbers(InterleavedSudoku *this)

{
  uint uVar1;
  Field *pFVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> permutation;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)(this->super_Sudoku).squared_size_,&local_39);
  if (0 < (this->super_Sudoku).squared_size_) {
    lVar8 = 0;
    do {
      lVar6 = lVar8 + 1;
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = (int)lVar6;
      iVar7 = (this->super_Sudoku).squared_size_;
      lVar8 = lVar6;
    } while (lVar6 < iVar7);
    if (0 < iVar7) {
      iVar7 = 0;
      lVar8 = 0;
      do {
        iVar3 = rand();
        lVar6 = iVar3 % ((this->super_Sudoku).squared_size_ + iVar7) + lVar8;
        iVar3 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] =
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar6];
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar6] = iVar3;
        lVar8 = lVar8 + 1;
        iVar3 = (this->super_Sudoku).squared_size_;
        uVar5 = (ulong)iVar3;
        iVar7 = iVar7 + -1;
      } while (lVar8 < (long)uVar5);
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            iVar3 = 0;
            do {
              iVar4 = Field::value((this->super_Sudoku).fields_.
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(int)uVar5 * iVar3 + iVar7].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (0 < iVar4) {
                pFVar2 = (this->super_Sudoku).fields_.
                         super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(this->super_Sudoku).squared_size_ * iVar3 + iVar7].
                         super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar4 = Field::value(pFVar2);
                Field::setValue(pFVar2,local_38.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1]);
              }
              iVar4 = (this->super_Sudoku).squared_size_;
              iVar4 = Field::value((this->super_Sudoku).fields_.
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(iVar3 + iVar4) * iVar4 + iVar7].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (0 < iVar4) {
                iVar4 = (this->super_Sudoku).squared_size_;
                pFVar2 = (this->super_Sudoku).fields_.
                         super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(iVar3 + iVar4) * iVar4 + iVar7].
                         super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar4 = Field::value(pFVar2);
                Field::setValue(pFVar2,local_38.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1]);
              }
              iVar3 = iVar3 + 1;
              uVar1 = (this->super_Sudoku).squared_size_;
              uVar5 = (ulong)uVar1;
            } while (iVar3 < (int)uVar1);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < (int)uVar5);
      }
    }
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InterleavedSudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  std::vector<int> permutation(squared_size_);
  for(int i=0; i<squared_size_; i++)
  {
    permutation[i] = i+1;
  }

  for(int i=0; i<squared_size_; i++)
  {
    int index = rand() % (squared_size_-i) + i;
    std::swap(permutation[i], permutation[index]);
  }

  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y,0)]->value() > 0)
        fields_[index(x,y,0)]->setValue(permutation[fields_[index(x,y,0)]->value()-1]);
      if(fields_[index(x,y,1)]->value() > 0)
        fields_[index(x,y,1)]->setValue(permutation[fields_[index(x,y,1)]->value()-1]);
    }
  }
}